

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj2pbrt.cpp
# Opt level: O1

bool __thiscall
tinyobj::MaterialFileReader::operator()
          (MaterialFileReader *this,string *matId,
          vector<tinyobj::material_t,_std::allocator<tinyobj::material_t>_> *materials,
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
          *matMap,string *err)

{
  size_type sVar1;
  pointer pcVar2;
  long *plVar3;
  ostream *poVar4;
  long *plVar5;
  string filepath;
  stringstream ss;
  ifstream matIStream;
  char *local_400;
  long local_3f8;
  char local_3f0;
  undefined7 uStack_3ef;
  long *local_3e0;
  long local_3d0 [2];
  long *local_3c0 [2];
  long local_3b0 [14];
  ios_base local_340 [264];
  long *local_238;
  long local_230;
  long local_228;
  long lStack_220;
  byte abStack_218 [488];
  
  local_400 = &local_3f0;
  local_3f8 = 0;
  local_3f0 = '\0';
  sVar1 = (this->m_mtlBasePath)._M_string_length;
  if (sVar1 == 0) {
    std::__cxx11::string::_M_assign((string *)&local_400);
  }
  else {
    pcVar2 = (this->m_mtlBasePath)._M_dataplus._M_p;
    local_3c0[0] = local_3b0;
    std::__cxx11::string::_M_construct<char*>((string *)local_3c0,pcVar2,pcVar2 + sVar1);
    plVar3 = (long *)std::__cxx11::string::_M_append
                               ((char *)local_3c0,(ulong)(matId->_M_dataplus)._M_p);
    plVar5 = plVar3 + 2;
    if ((long *)*plVar3 == plVar5) {
      local_228 = *plVar5;
      lStack_220 = plVar3[3];
      local_238 = &local_228;
    }
    else {
      local_228 = *plVar5;
      local_238 = (long *)*plVar3;
    }
    local_230 = plVar3[1];
    *plVar3 = (long)plVar5;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    std::__cxx11::string::operator=((string *)&local_400,(string *)&local_238);
    if (local_238 != &local_228) {
      operator_delete(local_238,local_228 + 1);
    }
    if (local_3c0[0] != local_3b0) {
      operator_delete(local_3c0[0],local_3b0[0] + 1);
    }
  }
  std::ifstream::ifstream(&local_238,local_400,_S_in);
  LoadMtl(matMap,materials,(istream *)&local_238);
  if ((abStack_218[local_238[-3]] & 5) != 0) {
    std::__cxx11::stringstream::stringstream((stringstream *)local_3c0);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_3b0,"WARN: Material file [ ",0x16);
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_3b0,local_400,local_3f8);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar4," ] not found. Created a default material.",0x29);
    std::__cxx11::stringbuf::str();
    std::__cxx11::string::_M_append((char *)err,(ulong)local_3e0);
    if (local_3e0 != local_3d0) {
      operator_delete(local_3e0,local_3d0[0] + 1);
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)local_3c0);
    std::ios_base::~ios_base(local_340);
  }
  std::ifstream::~ifstream(&local_238);
  if (local_400 != &local_3f0) {
    operator_delete(local_400,CONCAT71(uStack_3ef,local_3f0) + 1);
  }
  return true;
}

Assistant:

bool MaterialFileReader::operator()(const std::string &matId,
                                    std::vector<material_t> &materials,
                                    std::map<std::string, int> &matMap,
                                    std::string &err) {
  std::string filepath;

  if (!m_mtlBasePath.empty()) {
    filepath = std::string(m_mtlBasePath) + matId;
  } else {
    filepath = matId;
  }

  std::ifstream matIStream(filepath.c_str());
  LoadMtl(matMap, materials, matIStream);
  if (!matIStream) {
    std::stringstream ss;
    ss << "WARN: Material file [ " << filepath
       << " ] not found. Created a default material.";
    err += ss.str();
  }
  return true;
}